

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O0

void __thiscall
helics::CoreBroker::loadTimeMonitor(CoreBroker *this,bool firstLoad,string_view newFederate)

{
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  string_view searchValue;
  basic_string_view<char,_std::char_traits<char>_> __x;
  bool bVar1;
  BrokerState BVar2;
  __int_type_conflict _Var3;
  pointer pBVar4;
  char *in_RCX;
  size_t in_RDX;
  byte in_SIL;
  CoreBroker *in_RDI;
  ActionMessage timeMarker;
  __normal_iterator<helics::BasicFedInfo_*,_std::vector<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>_>
  fed;
  ActionMessage timeMarkerRem_1;
  BrokerState cState;
  ActionMessage timeMarkerRem;
  DualStringMappedVector<helics::BasicFedInfo,_helics::GlobalFederateId,_(reference_stability)1,_5>
  *in_stack_fffffffffffffb08;
  BaseType index;
  ActionMessage *in_stack_fffffffffffffb10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb18;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffb20;
  value<fmt::v11::context> *this_01;
  undefined4 in_stack_fffffffffffffb28;
  action_t in_stack_fffffffffffffb2c;
  CoreBroker *in_stack_fffffffffffffb30;
  char *in_stack_fffffffffffffb38;
  __normal_iterator<helics::BasicFedInfo_*,_std::vector<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>_>
  *this_02;
  undefined4 in_stack_fffffffffffffb40;
  undefined4 in_stack_fffffffffffffb44;
  undefined1 local_468 [32];
  __sv_type local_448;
  __sv_type local_438;
  BaseType local_428;
  GlobalFederateId local_424;
  BaseType local_420;
  BaseType local_41c;
  baseType local_418;
  BaseType local_408;
  BaseType local_400;
  undefined1 in_stack_fffffffffffffc6b;
  int in_stack_fffffffffffffc6c;
  BrokerBase *in_stack_fffffffffffffc70;
  string_view in_stack_fffffffffffffc78;
  GlobalFederateId in_stack_fffffffffffffc8c;
  __normal_iterator<helics::BasicFedInfo_*,_std::vector<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>_>
  local_340;
  char *local_338;
  undefined8 local_330;
  undefined1 local_328 [32];
  __sv_type local_308;
  __sv_type local_2f8;
  BaseType local_2e4;
  GlobalFederateId local_2e0;
  GlobalFederateId local_2dc [3];
  BaseType local_2d0;
  BaseType local_2c8;
  format_args in_stack_fffffffffffffd70;
  string_view in_stack_fffffffffffffd80;
  string_view in_stack_fffffffffffffdb0;
  DualStringMappedVector<helics::BasicFedInfo,_helics::GlobalFederateId,_(reference_stability)1,_5>
  *local_218;
  ActionMessage *pAStack_210;
  GlobalFederateId local_1f4;
  GlobalFederateId local_1f0 [6];
  BaseType local_1d8;
  BaseType local_1d0;
  __sv_type local_128;
  size_t local_118;
  char *local_110;
  byte local_101;
  basic_string_view<char,_std::char_traits<char>_> local_f8;
  undefined1 local_e8 [32];
  undefined8 local_c8;
  undefined1 *local_c0;
  char *local_b8;
  undefined8 uStack_b0;
  basic_string_view<char,_std::char_traits<char>_> *local_a0;
  string *local_98;
  char *local_90;
  undefined8 uStack_88;
  undefined1 *local_80;
  value<fmt::v11::context> local_78;
  undefined8 local_68;
  value<fmt::v11::context> *local_60;
  char *local_58;
  undefined8 uStack_50;
  string *local_40;
  char *local_38;
  undefined8 uStack_30;
  undefined1 *local_28;
  value<fmt::v11::context> *local_20;
  undefined8 *local_18;
  undefined1 *local_10;
  undefined8 *local_8;
  
  local_101 = in_SIL & 1;
  local_f8._M_len = in_RDX;
  local_f8._M_str = in_RCX;
  bVar1 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_f8);
  if (!bVar1) {
    local_118 = local_f8._M_len;
    local_110 = local_f8._M_str;
    local_128 = std::__cxx11::string::operator_cast_to_basic_string_view
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffffb10);
    __x._M_str._0_4_ = in_stack_fffffffffffffb40;
    __x._M_len = (size_t)in_stack_fffffffffffffb38;
    __x._M_str._4_4_ = in_stack_fffffffffffffb44;
    __y._M_len._4_4_ = in_stack_fffffffffffffb2c;
    __y._M_len._0_4_ = in_stack_fffffffffffffb28;
    __y._M_str = (char *)in_stack_fffffffffffffb30;
    bVar1 = std::operator==(__x,__y);
    if (bVar1) {
      return;
    }
  }
  if ((((local_101 & 1) == 0) &&
      (bVar1 = GlobalFederateId::isValid(&in_RDI->mTimeMonitorFederateId), bVar1)) &&
     (bVar1 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_f8), bVar1))
  {
    ActionMessage::ActionMessage
              ((ActionMessage *)in_stack_fffffffffffffb30,in_stack_fffffffffffffb2c);
    local_1d0 = (in_RDI->mTimeMonitorFederateId).gid;
    local_1d8 = (in_RDI->mTimeMonitorLocalFederateId).gid;
    routeMessage(in_stack_fffffffffffffb30,
                 (ActionMessage *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28));
    memset(local_1f0,0,4);
    GlobalFederateId::GlobalFederateId(local_1f0);
    (in_RDI->mTimeMonitorFederateId).gid = local_1f0[0].gid;
    _Var3 = std::__atomic_base::operator_cast_to_int
                      ((__atomic_base<int> *)in_stack_fffffffffffffb18);
    if (5 < _Var3) {
      GlobalFederateId::GlobalFederateId
                (&local_1f4,(GlobalBrokerId)(in_RDI->super_BrokerBase).global_broker_id_local.gid);
      getIdentifier_abi_cxx11_(in_RDI);
      std::__cxx11::string::operator_cast_to_basic_string_view
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffb10);
      CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffffb20,(char *)in_stack_fffffffffffffb18);
      BrokerBase::sendToLogger
                (in_stack_fffffffffffffc70,in_stack_fffffffffffffc8c,in_stack_fffffffffffffc6c,
                 in_stack_fffffffffffffc78,in_stack_fffffffffffffdb0,(bool)in_stack_fffffffffffffc6b
                );
      in_stack_fffffffffffffb08 = local_218;
      in_stack_fffffffffffffb10 = pAStack_210;
    }
    std::__cxx11::string::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffb10,
               (basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffb08);
    ActionMessage::~ActionMessage(in_stack_fffffffffffffb10);
  }
  else {
    BVar2 = BrokerBase::getBrokerState((BrokerBase *)0x5e9b7d);
    if ((BVar2 == OPERATING) || ((local_101 & 1) != 0)) {
      if ((BVar2 == OPERATING) &&
         (((local_101 & 1) == 0 &&
          (bVar1 = GlobalFederateId::isValid(&in_RDI->mTimeMonitorFederateId), bVar1)))) {
        ActionMessage::ActionMessage
                  ((ActionMessage *)in_stack_fffffffffffffb30,in_stack_fffffffffffffb2c);
        local_2c8 = (in_RDI->mTimeMonitorFederateId).gid;
        local_2d0 = (in_RDI->mTimeMonitorLocalFederateId).gid;
        routeMessage(in_stack_fffffffffffffb30,
                     (ActionMessage *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28))
        ;
        memset(local_2dc,0,4);
        GlobalFederateId::GlobalFederateId(local_2dc);
        (in_RDI->mTimeMonitorFederateId).gid = local_2dc[0].gid;
        _Var3 = std::__atomic_base::operator_cast_to_int
                          ((__atomic_base<int> *)in_stack_fffffffffffffb18);
        if (5 < _Var3) {
          local_2e4 = (in_RDI->super_BrokerBase).global_broker_id_local.gid;
          GlobalFederateId::GlobalFederateId(&local_2e0,(GlobalBrokerId)local_2e4);
          getIdentifier_abi_cxx11_(in_RDI);
          local_2f8 = std::__cxx11::string::operator_cast_to_basic_string_view
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_fffffffffffffb10);
          local_338 = " changing time monitor federate from {} to {}";
          local_330 = 0x2d;
          local_98 = &in_RDI->mTimeMonitorFederate;
          local_80 = local_328;
          local_90 = " changing time monitor federate from {} to {}";
          uStack_88 = 0x2d;
          local_a0 = &local_f8;
          local_b8 = " changing time monitor federate from {} to {}";
          uStack_b0 = 0x2d;
          ::fmt::v11::detail::value<fmt::v11::context>::
          value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
                    ((value<fmt::v11::context> *)in_stack_fffffffffffffb20,in_stack_fffffffffffffb18
                    );
          ::fmt::v11::detail::value<fmt::v11::context>::
          value<std::basic_string_view<char,_std::char_traits<char>_>,_char,_0>
                    ((value<fmt::v11::context> *)in_stack_fffffffffffffb20,
                     (basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffb18);
          local_8 = &local_c8;
          local_10 = local_e8;
          local_c8 = 0xdd;
          local_c0 = local_10;
          ::fmt::v11::vformat_abi_cxx11_(in_stack_fffffffffffffd80,in_stack_fffffffffffffd70);
          local_308 = std::__cxx11::string::operator_cast_to_basic_string_view
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_fffffffffffffb10);
          in_stack_fffffffffffffb08 =
               (DualStringMappedVector<helics::BasicFedInfo,_helics::GlobalFederateId,_(reference_stability)1,_5>
                *)local_308._M_len;
          in_stack_fffffffffffffb10 = (ActionMessage *)local_308._M_str;
          BrokerBase::sendToLogger
                    (in_stack_fffffffffffffc70,in_stack_fffffffffffffc8c,in_stack_fffffffffffffc6c,
                     in_stack_fffffffffffffc78,in_stack_fffffffffffffdb0,
                     (bool)in_stack_fffffffffffffc6b);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffb10);
        }
        ActionMessage::~ActionMessage(in_stack_fffffffffffffb10);
      }
      bVar1 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_f8);
      if (!bVar1) {
        std::__cxx11::string::operator=
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffb10,
                   (basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffb08);
      }
      std::__cxx11::string::operator_cast_to_basic_string_view
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffb10);
      searchValue._M_str = in_stack_fffffffffffffb38;
      searchValue._M_len = (size_t)in_stack_fffffffffffffb30;
      local_340 = gmlc::containers::
                  DualStringMappedVector<helics::BasicFedInfo,_helics::GlobalFederateId,_(reference_stability)1,_5>
                  ::find((DualStringMappedVector<helics::BasicFedInfo,_helics::GlobalFederateId,_(reference_stability)1,_5>
                          *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28),
                         searchValue);
      gmlc::containers::
      DualStringMappedVector<helics::BasicFedInfo,_helics::GlobalFederateId,_(reference_stability)1,_5>
      ::end(in_stack_fffffffffffffb08);
      bVar1 = __gnu_cxx::
              operator==<helics::BasicFedInfo_*,_const_helics::BasicFedInfo_*,_std::vector<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>_>
                        ((__normal_iterator<helics::BasicFedInfo_*,_std::vector<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>_>
                          *)in_stack_fffffffffffffb10,
                         (__normal_iterator<const_helics::BasicFedInfo_*,_std::vector<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>_>
                          *)in_stack_fffffffffffffb08);
      index = (BaseType)((ulong)in_stack_fffffffffffffb08 >> 0x20);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        local_428 = (in_RDI->super_BrokerBase).global_broker_id_local.gid;
        GlobalFederateId::GlobalFederateId(&local_424,(GlobalBrokerId)local_428);
        getIdentifier_abi_cxx11_(in_RDI);
        local_438 = std::__cxx11::string::operator_cast_to_basic_string_view
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_fffffffffffffb10);
        local_40 = &in_RDI->mTimeMonitorFederate;
        local_28 = local_468;
        local_38 = " unrecognized timing federate {}";
        uStack_30 = 0x20;
        local_58 = " unrecognized timing federate {}";
        uStack_50 = 0x20;
        this_01 = &local_78;
        ::fmt::v11::detail::value<fmt::v11::context>::
        value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
                  (this_01,in_stack_fffffffffffffb18);
        local_18 = &local_68;
        local_68 = 0xd;
        local_20 = this_01;
        local_60 = this_01;
        ::fmt::v11::vformat_abi_cxx11_(in_stack_fffffffffffffd80,in_stack_fffffffffffffd70);
        local_448 = std::__cxx11::string::operator_cast_to_basic_string_view
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_fffffffffffffb10);
        this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_448._M_str;
        BrokerBase::sendToLogger
                  (in_stack_fffffffffffffc70,in_stack_fffffffffffffc8c,in_stack_fffffffffffffc6c,
                   in_stack_fffffffffffffc78,in_stack_fffffffffffffdb0,
                   (bool)in_stack_fffffffffffffc6b);
        std::__cxx11::string::~string(this_00);
      }
      else {
        ActionMessage::ActionMessage
                  ((ActionMessage *)in_stack_fffffffffffffb30,in_stack_fffffffffffffb2c);
        this_02 = &local_340;
        pBVar4 = __gnu_cxx::
                 __normal_iterator<helics::BasicFedInfo_*,_std::vector<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>_>
                 ::operator->(this_02);
        local_400 = (pBVar4->global_id).gid;
        pBVar4 = __gnu_cxx::
                 __normal_iterator<helics::BasicFedInfo_*,_std::vector<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>_>
                 ::operator->(this_02);
        (in_RDI->mTimeMonitorFederateId).gid = (pBVar4->global_id).gid;
        local_418 = (baseType)TimeRepresentation<count_time<9,_long>_>::minVal();
        (in_RDI->mTimeMonitorLastLogTime).internalTimeCode = local_418;
        local_420 = (in_RDI->super_BrokerBase).global_broker_id_local.gid;
        local_41c = (BaseType)
                    getSpecialFederateId((GlobalBrokerId)(BaseType)in_stack_fffffffffffffb10,index);
        (in_RDI->mTimeMonitorLocalFederateId).gid = local_41c;
        local_408 = (in_RDI->mTimeMonitorLocalFederateId).gid;
        routeMessage(in_stack_fffffffffffffb30,
                     (ActionMessage *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28))
        ;
        ActionMessage::~ActionMessage(in_stack_fffffffffffffb10);
      }
    }
    else if ((BVar2 < OPERATING) &&
            (bVar1 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_f8),
            !bVar1)) {
      std::__cxx11::string::operator=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffb10,
                 (basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffb08);
    }
  }
  return;
}

Assistant:

void CoreBroker::loadTimeMonitor(bool firstLoad, std::string_view newFederate)
{
    if (!newFederate.empty() && newFederate == mTimeMonitorFederate) {
        return;
    }
    if (!firstLoad && mTimeMonitorFederateId.isValid() && newFederate.empty()) {
        // do a disconnect
        ActionMessage timeMarkerRem(CMD_REMOVE_DEPENDENT);
        timeMarkerRem.dest_id = mTimeMonitorFederateId;
        timeMarkerRem.source_id = mTimeMonitorLocalFederateId;
        routeMessage(timeMarkerRem);
        mTimeMonitorFederateId = GlobalFederateId{};
        LOG_SUMMARY(global_broker_id_local, getIdentifier(), " disconnected time monitor federate");
        mTimeMonitorFederate = newFederate;
        return;
    }
    auto cState = getBrokerState();
    if (cState == BrokerState::OPERATING || firstLoad) {
        if (cState == BrokerState::OPERATING && !firstLoad) {
            if (mTimeMonitorFederateId.isValid()) {
                // do a disconnect
                ActionMessage timeMarkerRem(CMD_REMOVE_DEPENDENT);
                timeMarkerRem.dest_id = mTimeMonitorFederateId;
                timeMarkerRem.source_id = mTimeMonitorLocalFederateId;
                routeMessage(timeMarkerRem);
                mTimeMonitorFederateId = GlobalFederateId{};
                LOG_SUMMARY(global_broker_id_local,
                            getIdentifier(),
                            fmt::format(" changing time monitor federate from {} to {}",
                                        mTimeMonitorFederate,
                                        newFederate));
            }
        }
        if (!newFederate.empty()) {
            mTimeMonitorFederate = newFederate;
        }
        auto fed = mFederates.find(mTimeMonitorFederate);
        if (fed != mFederates.end()) {
            ActionMessage timeMarker(CMD_ADD_DEPENDENT);
            timeMarker.dest_id = fed->global_id;

            mTimeMonitorFederateId = fed->global_id;
            mTimeMonitorLastLogTime = Time::minVal();
            mTimeMonitorLocalFederateId = getSpecialFederateId(global_broker_id_local, 0);
            timeMarker.source_id = mTimeMonitorLocalFederateId;
            routeMessage(timeMarker);
        } else {
            LOG_WARNING(global_broker_id_local,
                        getIdentifier(),
                        fmt::format(" unrecognized timing federate {}", mTimeMonitorFederate));
        }
    } else if (cState < BrokerState::OPERATING) {
        if (!newFederate.empty()) {
            mTimeMonitorFederate = newFederate;
        }
    }
}